

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O2

int lj_cf_os_date(lua_State *L)

{
  char cVar1;
  uint64_t uVar2;
  TValue *pTVar3;
  int iVar4;
  char *__format;
  tm *__tp;
  size_t lenx;
  GCstr *pGVar5;
  char *pcVar6;
  uint uVar7;
  uint sz;
  lua_Number lVar8;
  time_t t;
  SBuf *local_70;
  tm rtm;
  
  __format = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar4 = lua_type(L,2);
  if (iVar4 < 1) {
    t = time((time_t *)0x0);
  }
  else {
    lVar8 = luaL_checknumber(L,2);
    t = (time_t)lVar8;
  }
  if (*__format == '!') {
    __format = __format + 1;
    __tp = gmtime_r(&t,(tm *)&rtm);
  }
  else {
    __tp = localtime_r(&t,(tm *)&rtm);
  }
  if (__tp == (tm *)0x0) {
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->u64 = 0xffffffffffffffff;
  }
  else {
    cVar1 = *__format;
    if (cVar1 == '\0') {
      uVar2 = (L->glref).ptr64;
      pTVar3 = L->top;
      L->top = pTVar3 + 1;
      pTVar3->u64 = uVar2 + 0x78 | 0xfffd800000000000;
    }
    else if (((cVar1 == '*') && (__format[1] == 't')) && (__format[2] == '\0')) {
      lua_createtable(L,0,9);
      setfield(L,"sec",__tp->tm_sec);
      setfield(L,"min",__tp->tm_min);
      setfield(L,"hour",__tp->tm_hour);
      setfield(L,"day",__tp->tm_mday);
      setfield(L,"month",__tp->tm_mon + 1);
      setfield(L,"year",__tp->tm_year + 0x76c);
      setfield(L,"wday",__tp->tm_wday + 1);
      setfield(L,"yday",__tp->tm_yday + 1);
      if (-1 < __tp->tm_isdst) {
        lua_pushboolean(L,__tp->tm_isdst);
        lua_setfield(L,-2,"isdst");
      }
    }
    else {
      uVar2 = (L->glref).ptr64;
      sz = 0;
      pcVar6 = __format;
      while (pcVar6 = pcVar6 + 1, cVar1 != '\0') {
        uVar7 = sz + 1;
        sz = sz + 0x1e;
        if (cVar1 != '%') {
          sz = uVar7;
        }
        cVar1 = *pcVar6;
      }
      local_70 = (SBuf *)(uVar2 + 200);
      *(lua_State **)(uVar2 + 0xe0) = L;
      for (iVar4 = -4; iVar4 != 0; iVar4 = iVar4 + 1) {
        pcVar6 = *(char **)(uVar2 + 0xd8);
        uVar7 = (int)*(undefined8 *)(uVar2 + 0xd0) - (int)pcVar6;
        if (uVar7 < sz) {
          pcVar6 = lj_buf_need2(local_70,sz);
          uVar7 = (int)*(undefined8 *)(uVar2 + 0xd0) - (int)*(undefined8 *)(uVar2 + 0xd8);
        }
        lenx = strftime(pcVar6,(ulong)uVar7,__format,__tp);
        if (lenx != 0) {
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          pGVar5 = lj_str_new(L,pcVar6,lenx);
          pTVar3->u64 = (ulong)pGVar5 | 0xfffd800000000000;
          uVar2 = (L->glref).ptr64;
          if (*(ulong *)(uVar2 + 0x10) < *(ulong *)(uVar2 + 0x18)) {
            return 1;
          }
          lj_gc_step(L);
          return 1;
        }
        sz = sz + (sz | 1);
      }
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(os_date)
{
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, (time_t)luaL_checknumber, 2, time(NULL));
  struct tm *stm;
#if LJ_TARGET_POSIX
  struct tm rtm;
#endif
  if (*s == '!') {  /* UTC? */
    s++;  /* Skip '!' */
#if LJ_TARGET_POSIX
    stm = gmtime_r(&t, &rtm);
#else
    stm = gmtime(&t);
#endif
  } else {
#if LJ_TARGET_POSIX
    stm = localtime_r(&t, &rtm);
#else
    stm = localtime(&t);
#endif
  }
  if (stm == NULL) {  /* Invalid date? */
    setnilV(L->top++);
  } else if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setfield(L, "sec", stm->tm_sec);
    setfield(L, "min", stm->tm_min);
    setfield(L, "hour", stm->tm_hour);
    setfield(L, "day", stm->tm_mday);
    setfield(L, "month", stm->tm_mon+1);
    setfield(L, "year", stm->tm_year+1900);
    setfield(L, "wday", stm->tm_wday+1);
    setfield(L, "yday", stm->tm_yday+1);
    setboolfield(L, "isdst", stm->tm_isdst);
  } else if (*s) {
    SBuf *sb = &G(L)->tmpbuf;
    MSize sz = 0, retry = 4;
    const char *q;
    for (q = s; *q; q++)
      sz += (*q == '%') ? 30 : 1;  /* Overflow doesn't matter. */
    setsbufL(sb, L);
    while (retry--) {  /* Limit growth for invalid format or empty result. */
      char *buf = lj_buf_need(sb, sz);
      size_t len = strftime(buf, sbufsz(sb), s, stm);
      if (len) {
	setstrV(L, L->top++, lj_str_new(L, buf, len));
	lj_gc_check(L);
	break;
      }
      sz += (sz|1);
    }
  } else {
    setstrV(L, L->top++, &G(L)->strempty);
  }
  return 1;
}